

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

size_t utf8_string_length(utf8_char_t *data,utf8_size_t size)

{
  size_t sVar1;
  utf8_size_t in_RSI;
  utf8_char_t *in_RDI;
  size_t byts;
  size_t char_length;
  size_t local_20;
  size_t in_stack_ffffffffffffffe8;
  utf8_char_t *local_8;
  
  local_20 = 0;
  local_8 = in_RDI;
  if (in_RSI == 0) {
    in_RSI = utf8_char_count((char *)0x0,in_stack_ffffffffffffffe8);
  }
  while ((in_RSI != 0 && (sVar1 = utf8_char_length(local_8), sVar1 != 0))) {
    local_8 = local_8 + sVar1;
    local_20 = sVar1 + local_20;
    in_RSI = in_RSI - 1;
  }
  return local_20;
}

Assistant:

size_t utf8_string_length(const utf8_char_t* data, utf8_size_t size)
{
    size_t char_length, byts = 0;

    if (0 == size) {
        size = utf8_char_count(data, 0);
    }

    for (; 0 < size; --size) {
        if (0 == (char_length = utf8_char_length(data))) {
            break;
        }

        data += char_length;
        byts += char_length;
    }

    return byts;
}